

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

dtime_t duckdb::TryCastCInternal<short,duckdb::dtime_t,duckdb::TryCast>
                  (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  undefined1 unaff_retaddr;
  dtime_t *in_stack_00000008;
  short in_stack_00000016;
  dtime_t result_value;
  idx_t in_stack_ffffffffffffffb8;
  duckdb_result *in_stack_ffffffffffffffc0;
  undefined8 local_28;
  undefined8 local_8;
  
  UnsafeFetch<short>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0x1949ce7);
  bVar1 = TryCast::Operation<short,duckdb::dtime_t>
                    (in_stack_00000016,in_stack_00000008,(bool)unaff_retaddr);
  if (bVar1) {
    local_8 = local_28;
  }
  else {
    local_8 = FetchDefaultValue::Operation<duckdb::dtime_t>();
  }
  return (dtime_t)local_8;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}